

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O3

void __thiscall
icu_63::TimeZoneNames::getDisplayNames
          (TimeZoneNames *this,UnicodeString *tzID,UTimeZoneNameType *types,int32_t numTypes,
          UDate date,UnicodeString *dest,UErrorCode *status)

{
  ulong uVar1;
  UnicodeString mzID;
  UnicodeString local_70;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (0x1f < (ushort)(tzID->fUnion).fStackFields.fLengthAndFlags)) {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    if (0 < numTypes) {
      uVar1 = 0;
      do {
        (*(this->super_UObject)._vptr_UObject[10])(this,tzID,(ulong)types[uVar1],dest);
        if ((ushort)(dest->fUnion).fStackFields.fLengthAndFlags < 0x20) {
          if ((ushort)local_70.fUnion.fStackFields.fLengthAndFlags < 0x20) {
            (*(this->super_UObject)._vptr_UObject[7])(date,this,tzID,&local_70);
          }
          (*(this->super_UObject)._vptr_UObject[9])(this,&local_70,(ulong)types[uVar1],dest);
        }
        uVar1 = uVar1 + 1;
        dest = dest + 1;
      } while ((uint)numTypes != uVar1);
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  return;
}

Assistant:

void
TimeZoneNames::getDisplayNames(const UnicodeString& tzID, const UTimeZoneNameType types[], int32_t numTypes, UDate date, UnicodeString dest[], UErrorCode& status) const {
    if (U_FAILURE(status)) { return; }
    if (tzID.isEmpty()) { return; }
    UnicodeString mzID;
    for (int i = 0; i < numTypes; i++) {
        getTimeZoneDisplayName(tzID, types[i], dest[i]);
        if (dest[i].isEmpty()) {
            if (mzID.isEmpty()) {
                getMetaZoneID(tzID, date, mzID);
            }
            getMetaZoneDisplayName(mzID, types[i], dest[i]);
        }
    }
}